

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlAttribute * __thiscall TiXmlAttributeSet::FindOrCreate(TiXmlAttributeSet *this,char *_name)

{
  int iVar1;
  TiXmlAttribute *addMe;
  size_t len;
  
  addMe = &this->sentinel;
  do {
    addMe = addMe->next;
    if (addMe == &this->sentinel) {
      addMe = (TiXmlAttribute *)0x0;
      break;
    }
    iVar1 = strcmp(((addMe->name).rep_)->str,_name);
  } while (iVar1 != 0);
  if (addMe == (TiXmlAttribute *)0x0) {
    addMe = (TiXmlAttribute *)operator_new(0x40);
    (addMe->super_TiXmlBase).location.row = -1;
    (addMe->super_TiXmlBase).location.col = -1;
    (addMe->super_TiXmlBase).userData = (void *)0x0;
    addMe->document = (TiXmlDocument *)0x0;
    (addMe->super_TiXmlBase)._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlAttribute_00218c00;
    (addMe->name).rep_ = &TiXmlString::nullrep_;
    (addMe->value).rep_ = &TiXmlString::nullrep_;
    addMe->prev = (TiXmlAttribute *)0x0;
    addMe->next = (TiXmlAttribute *)0x0;
    Add(this,addMe);
    len = strlen(_name);
    TiXmlString::assign(&addMe->name,_name,len);
  }
  return addMe;
}

Assistant:

TiXmlAttribute* TiXmlAttributeSet::FindOrCreate( const char* _name )
{
	TiXmlAttribute* attrib = Find( _name );
	if ( !attrib ) {
		attrib = new TiXmlAttribute();
		Add( attrib );
		attrib->SetName( _name );
	}
	return attrib;
}